

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::EmitTypeOfFld
          (ByteCodeGenerator *this,FuncInfo *funcInfo,PropertyId propertyId,RegSlot value,
          RegSlot instance,OpCode ldFldOp,bool reuseLoc)

{
  RegSlot value_00;
  uint uVar1;
  OpCode op;
  undefined6 in_register_0000008a;
  int iVar2;
  
  value_00 = FuncInfo::AcquireTmpRegister(funcInfo);
  iVar2 = (int)CONCAT62(in_register_0000008a,ldFldOp);
  if ((iVar2 == 0x62) || (iVar2 == 0x131)) {
    uVar1 = FuncInfo::FindOrAddInlineCacheId(funcInfo,instance,propertyId,false,false);
    Js::ByteCodeWriter::ElementP(&this->m_writer,ldFldOp,value_00,uVar1,false,true);
  }
  else if (iVar2 == 0x123) {
    uVar1 = FuncInfo::FindOrAddRootObjectInlineCacheId(funcInfo,propertyId,false,false);
    Js::ByteCodeWriter::PatchableRootProperty
              (&this->m_writer,LdRootFldForTypeOf,value_00,uVar1,false,false,true);
  }
  else {
    uVar1 = FuncInfo::FindOrAddInlineCacheId(funcInfo,instance,propertyId,false,false);
    Js::ByteCodeWriter::PatchableProperty
              (&this->m_writer,ldFldOp,value_00,instance,uVar1,false,true);
  }
  op = Typeof;
  if (reuseLoc) {
    op = Typeof_ReuseLoc;
  }
  Js::ByteCodeWriter::Reg2(&this->m_writer,op,value,value_00);
  FuncInfo::ReleaseTmpRegister(funcInfo,value_00);
  return;
}

Assistant:

void ByteCodeGenerator::EmitTypeOfFld(FuncInfo * funcInfo, Js::PropertyId propertyId, Js::RegSlot value, Js::RegSlot instance, Js::OpCode ldFldOp, bool reuseLoc)
{

    uint cacheId;
    Js::RegSlot tmpReg = funcInfo->AcquireTmpRegister();
    switch (ldFldOp)
    {
    case Js::OpCode::LdRootFldForTypeOf:
        cacheId = funcInfo->FindOrAddRootObjectInlineCacheId(propertyId, false, false);
        this->Writer()->PatchableRootProperty(ldFldOp, tmpReg, cacheId, false, false);
        break;

    case Js::OpCode::LdLocalFld:
    case Js::OpCode::ScopedLdFldForTypeOf:
        cacheId = funcInfo->FindOrAddInlineCacheId(instance, propertyId, false, false);
        this->Writer()->ElementP(ldFldOp, tmpReg, cacheId);
        break;

    default:
        cacheId = funcInfo->FindOrAddInlineCacheId(instance, propertyId, false, false);
        this->Writer()->PatchableProperty(ldFldOp, tmpReg, instance, cacheId);
        break;
    }

    this->Writer()->Reg2(reuseLoc ? Js::OpCode::Typeof_ReuseLoc : Js::OpCode::Typeof, value, tmpReg);
    funcInfo->ReleaseTmpRegister(tmpReg);
}